

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O0

void __thiscall iu_Matcher_x_iutest_x_AnyOf_Test::Body(iu_Matcher_x_iutest_x_AnyOf_Test *this)

{
  bool bVar1;
  detail *pdVar2;
  string *in_RCX;
  AssertionResult *in_R8;
  AssertionResult *ar;
  HasSubstrMatcher<const_char_(&)[2]> *in_stack_fffffffffffff518;
  string local_aa0;
  string local_a80;
  AssertionHelper local_a60;
  Fixed local_a30;
  HasSubstrMatcher<const_char_(&)[2]> local_8a8;
  HasSubstrMatcher<const_char_(&)[2]> local_898;
  HasSubstrMatcher<const_char_(&)[2]> local_888;
  HasSubstrMatcher<const_char_(&)[2]> local_878;
  HasSubstrMatcher<const_char_(&)[2]> local_868;
  undefined1 local_858 [16];
  HasSubstrMatcher<const_char_(&)[2]> local_848;
  HasSubstrMatcher<const_char_(&)[2]> local_838;
  HasSubstrMatcher<const_char_(&)[2]> local_828;
  AnyOfMatcher<iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>_>
  local_818;
  undefined1 local_780 [8];
  AssertionResult iutest_ar_3;
  string local_738;
  AssertionHelper local_718;
  Fixed local_6e8;
  StartsWithMatcher<const_char_(&)[3]> local_560;
  StartsWithMatcher<const_char_(&)[3]> local_550;
  AnyOfMatcher<iutest::detail::StartsWithMatcher<const_char_(&)[3]>,_iutest::detail::EndsWithMatcher<const_char_(&)[3]>_>
  local_540;
  undefined1 local_518 [8];
  AssertionResult iutest_ar_2;
  string local_4d0;
  AssertionHelper local_4b0;
  Fixed local_480;
  StartsWithMatcher<const_char_(&)[3]> local_2f8;
  StartsWithMatcher<const_char_(&)[3]> local_2e8;
  AnyOfMatcher<iutest::detail::StartsWithMatcher<const_char_(&)[3]>,_iutest::detail::EndsWithMatcher<const_char_(&)[3]>_>
  local_2d8;
  undefined1 local_2b0 [8];
  AssertionResult iutest_ar_1;
  string local_268;
  AssertionHelper local_248;
  Fixed local_218;
  StartsWithMatcher<const_char_(&)[3]> local_80;
  StartsWithMatcher<const_char_(&)[3]> local_70;
  AnyOfMatcher<iutest::detail::StartsWithMatcher<const_char_(&)[3]>,_iutest::detail::EndsWithMatcher<const_char_(&)[3]>_>
  local_60;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_Matcher_x_iutest_x_AnyOf_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  iutest::matchers::StartsWith<char[3]>((matchers *)&local_70,(char (*) [3])"ho");
  iutest::matchers::EndsWith<char[3]>((matchers *)&local_80,(char (*) [3])0x2cf800);
  iutest::matchers::
  AnyOf<iutest::detail::StartsWithMatcher<char_const(&)[3]>,iutest::detail::EndsWithMatcher<char_const(&)[3]>>
            (&local_60,(matchers *)&local_70,&local_80,(EndsWithMatcher<const_char_(&)[3]> *)in_RCX)
  ;
  iutest::detail::
  AnyOfMatcher<iutest::detail::StartsWithMatcher<char_const(&)[3]>,iutest::detail::EndsWithMatcher<char_const(&)[3]>>
  ::operator()((AssertionResult *)local_38,
               (AnyOfMatcher<iutest::detail::StartsWithMatcher<char_const(&)[3]>,iutest::detail::EndsWithMatcher<char_const(&)[3]>>
                *)&local_60,(char (*) [5])0x2d05a8);
  iutest::detail::
  AnyOfMatcher<iutest::detail::StartsWithMatcher<const_char_(&)[3]>,_iutest::detail::EndsWithMatcher<const_char_(&)[3]>_>
  ::~AnyOfMatcher(&local_60);
  iutest::detail::EndsWithMatcher<const_char_(&)[3]>::~EndsWithMatcher
            ((EndsWithMatcher<const_char_(&)[3]> *)&local_80);
  iutest::detail::StartsWithMatcher<const_char_(&)[3]>::~StartsWithMatcher(&local_70);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_218,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_218);
    iutest::PrintToString<char[5]>((string *)&iutest_ar_1.m_result,(char (*) [5])0x2d05a8);
    pdVar2 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_268,pdVar2,"AnyOf( StartsWith(\"ho\"), EndsWith(\"ge\"))",local_38,in_R8);
    in_RCX = &local_268;
    in_R8 = (AssertionResult *)0x1;
    iutest::AssertionHelper::AssertionHelper
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x378,in_RCX,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_248,&local_218);
    iutest::AssertionHelper::~AssertionHelper(&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_218);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  iutest::detail::AlwaysZero();
  iutest::matchers::StartsWith<char[3]>((matchers *)&local_2e8,(char (*) [3])"ho");
  iutest::matchers::EndsWith<char[3]>((matchers *)&local_2f8,(char (*) [3])0x2d0664);
  iutest::matchers::
  AnyOf<iutest::detail::StartsWithMatcher<char_const(&)[3]>,iutest::detail::EndsWithMatcher<char_const(&)[3]>>
            (&local_2d8,(matchers *)&local_2e8,&local_2f8,
             (EndsWithMatcher<const_char_(&)[3]> *)in_RCX);
  iutest::detail::
  AnyOfMatcher<iutest::detail::StartsWithMatcher<char_const(&)[3]>,iutest::detail::EndsWithMatcher<char_const(&)[3]>>
  ::operator()((AssertionResult *)local_2b0,
               (AnyOfMatcher<iutest::detail::StartsWithMatcher<char_const(&)[3]>,iutest::detail::EndsWithMatcher<char_const(&)[3]>>
                *)&local_2d8,(char (*) [5])0x2d05a8);
  iutest::detail::
  AnyOfMatcher<iutest::detail::StartsWithMatcher<const_char_(&)[3]>,_iutest::detail::EndsWithMatcher<const_char_(&)[3]>_>
  ::~AnyOfMatcher(&local_2d8);
  iutest::detail::EndsWithMatcher<const_char_(&)[3]>::~EndsWithMatcher
            ((EndsWithMatcher<const_char_(&)[3]> *)&local_2f8);
  iutest::detail::StartsWithMatcher<const_char_(&)[3]>::~StartsWithMatcher(&local_2e8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar1) {
    memset(&local_480,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_480);
    iutest::PrintToString<char[5]>((string *)&iutest_ar_2.m_result,(char (*) [5])0x2d05a8);
    pdVar2 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_4d0,pdVar2,"AnyOf( StartsWith(\"ho\"), EndsWith(\"Ge\"))",local_2b0,in_R8);
    in_RCX = &local_4d0;
    in_R8 = (AssertionResult *)0x1;
    iutest::AssertionHelper::AssertionHelper
              (&local_4b0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x379,in_RCX,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_4b0,&local_480);
    iutest::AssertionHelper::~AssertionHelper(&local_4b0);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::__cxx11::string::~string((string *)&iutest_ar_2.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_480);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  iutest::detail::AlwaysZero();
  iutest::matchers::StartsWith<char[3]>((matchers *)&local_550,(char (*) [3])0x2d05db);
  iutest::matchers::EndsWith<char[3]>((matchers *)&local_560,(char (*) [3])0x2cf800);
  iutest::matchers::
  AnyOf<iutest::detail::StartsWithMatcher<char_const(&)[3]>,iutest::detail::EndsWithMatcher<char_const(&)[3]>>
            (&local_540,(matchers *)&local_550,&local_560,
             (EndsWithMatcher<const_char_(&)[3]> *)in_RCX);
  iutest::detail::
  AnyOfMatcher<iutest::detail::StartsWithMatcher<char_const(&)[3]>,iutest::detail::EndsWithMatcher<char_const(&)[3]>>
  ::operator()((AssertionResult *)local_518,
               (AnyOfMatcher<iutest::detail::StartsWithMatcher<char_const(&)[3]>,iutest::detail::EndsWithMatcher<char_const(&)[3]>>
                *)&local_540,(char (*) [5])0x2d05a8);
  iutest::detail::
  AnyOfMatcher<iutest::detail::StartsWithMatcher<const_char_(&)[3]>,_iutest::detail::EndsWithMatcher<const_char_(&)[3]>_>
  ::~AnyOfMatcher(&local_540);
  iutest::detail::EndsWithMatcher<const_char_(&)[3]>::~EndsWithMatcher
            ((EndsWithMatcher<const_char_(&)[3]> *)&local_560);
  iutest::detail::StartsWithMatcher<const_char_(&)[3]>::~StartsWithMatcher(&local_550);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_518);
  if (!bVar1) {
    memset(&local_6e8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_6e8);
    iutest::PrintToString<char[5]>((string *)&iutest_ar_3.m_result,(char (*) [5])0x2d05a8);
    pdVar2 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_738,pdVar2,"AnyOf( StartsWith(\"Ho\"), EndsWith(\"ge\"))",local_518,in_R8);
    iutest::AssertionHelper::AssertionHelper
              (&local_718,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x37a,&local_738,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_718,&local_6e8);
    iutest::AssertionHelper::~AssertionHelper(&local_718);
    std::__cxx11::string::~string((string *)&local_738);
    std::__cxx11::string::~string((string *)&iutest_ar_3.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_6e8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_518);
  iutest::detail::AlwaysZero();
  iutest::matchers::HasSubstr<char[2]>((matchers *)&local_828,(char (*) [2])0x2d02fc);
  iutest::matchers::HasSubstr<char[2]>((matchers *)(local_858 + 0x20),(char (*) [2])0x2d030e);
  iutest::matchers::HasSubstr<char[2]>((matchers *)(local_858 + 0x10),(char (*) [2])0x2d0935);
  iutest::matchers::HasSubstr<char[2]>((matchers *)local_858,(char (*) [2])0x2d0be6);
  iutest::matchers::HasSubstr<char[2]>((matchers *)&local_868,(char (*) [2])0x2d0d86);
  iutest::matchers::HasSubstr<char[2]>((matchers *)&local_878,(char (*) [2])0x2d17d3);
  iutest::matchers::HasSubstr<char[2]>((matchers *)&local_888,(char (*) [2])"6");
  iutest::matchers::HasSubstr<char[2]>((matchers *)&local_898,(char (*) [2])0x2d2f12);
  iutest::matchers::HasSubstr<char[2]>((matchers *)&local_8a8,(char (*) [2])0x2d301a);
  ar = (AssertionResult *)local_858;
  iutest::matchers::
  AnyOf<iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>>
            (&local_818,(matchers *)&local_828,
             (HasSubstrMatcher<const_char_(&)[2]> *)(local_858 + 0x20),
             (HasSubstrMatcher<const_char_(&)[2]> *)(local_858 + 0x10),
             (HasSubstrMatcher<const_char_(&)[2]> *)ar,&local_868,&local_878,&local_888,&local_898,
             &local_8a8,in_stack_fffffffffffff518);
  iutest::detail::
  AnyOfMatcher<iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>>
  ::operator()((AssertionResult *)local_780,
               (AnyOfMatcher<iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>>
                *)&local_818,(char (*) [6])"hoge7");
  iutest::detail::
  AnyOfMatcher<iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>_>
  ::~AnyOfMatcher(&local_818);
  iutest::detail::HasSubstrMatcher<const_char_(&)[2]>::~HasSubstrMatcher(&local_8a8);
  iutest::detail::HasSubstrMatcher<const_char_(&)[2]>::~HasSubstrMatcher(&local_898);
  iutest::detail::HasSubstrMatcher<const_char_(&)[2]>::~HasSubstrMatcher(&local_888);
  iutest::detail::HasSubstrMatcher<const_char_(&)[2]>::~HasSubstrMatcher(&local_878);
  iutest::detail::HasSubstrMatcher<const_char_(&)[2]>::~HasSubstrMatcher(&local_868);
  iutest::detail::HasSubstrMatcher<const_char_(&)[2]>::~HasSubstrMatcher
            ((HasSubstrMatcher<const_char_(&)[2]> *)local_858);
  iutest::detail::HasSubstrMatcher<const_char_(&)[2]>::~HasSubstrMatcher
            ((HasSubstrMatcher<const_char_(&)[2]> *)(local_858 + 0x10));
  iutest::detail::HasSubstrMatcher<const_char_(&)[2]>::~HasSubstrMatcher
            ((HasSubstrMatcher<const_char_(&)[2]> *)(local_858 + 0x20));
  iutest::detail::HasSubstrMatcher<const_char_(&)[2]>::~HasSubstrMatcher(&local_828);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_780);
  if (!bVar1) {
    memset(&local_a30,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_a30);
    iutest::PrintToString<char[6]>(&local_aa0,(char (*) [6])"hoge7");
    pdVar2 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_a80,pdVar2,
               "AnyOf( HasSubstr(\"0\") , HasSubstr(\"1\") , HasSubstr(\"2\") , HasSubstr(\"3\") , HasSubstr(\"4\") , HasSubstr(\"5\") , HasSubstr(\"6\") , HasSubstr(\"7\") , HasSubstr(\"8\") )"
               ,local_780,ar);
    iutest::AssertionHelper::AssertionHelper
              (&local_a60,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x385,&local_a80,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_a60,&local_a30);
    iutest::AssertionHelper::~AssertionHelper(&local_a60);
    std::__cxx11::string::~string((string *)&local_a80);
    std::__cxx11::string::~string((string *)&local_aa0);
    iutest::AssertionHelper::Fixed::~Fixed(&local_a30);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_780);
  return;
}

Assistant:

IUTEST(Matcher, AnyOf)
{
    IUTEST_EXPECT_THAT("hoge", AnyOf( StartsWith("ho"), EndsWith("ge")));
    IUTEST_EXPECT_THAT("hoge", AnyOf( StartsWith("ho"), EndsWith("Ge")));
    IUTEST_EXPECT_THAT("hoge", AnyOf( StartsWith("Ho"), EndsWith("ge")));
    IUTEST_EXPECT_THAT("hoge7", AnyOf(
          HasSubstr("0")
        , HasSubstr("1")
        , HasSubstr("2")
        , HasSubstr("3")
        , HasSubstr("4")
        , HasSubstr("5")
        , HasSubstr("6")
        , HasSubstr("7")
        , HasSubstr("8")
    ));
}